

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

ImVec2 CalcNextScrollFromScrollTargetAndClamp(ImGuiWindow *window)

{
  float *pfVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float snap_y_max;
  float snap_y_min;
  float scroll_target_y;
  float center_y_ratio;
  float decoration_up_height;
  float snap_x_max;
  float snap_x_min;
  float scroll_target_x;
  float center_x_ratio;
  ImGuiWindow *window_local;
  ImVec2 scroll;
  
  window_local = *(ImGuiWindow **)&window->Scroll;
  if ((window->ScrollTarget).x <= 3.4028235e+38 && (window->ScrollTarget).x != 3.4028235e+38) {
    fVar4 = (window->ScrollTargetCenterRatio).x;
    snap_x_max = (window->ScrollTarget).x;
    if (0.0 < (window->ScrollTargetEdgeSnapDist).x) {
      snap_x_max = CalcScrollEdgeSnap(snap_x_max,0.0,(window->ScrollMax).x + (window->Size).x,
                                      (window->ScrollTargetEdgeSnapDist).x,fVar4);
    }
    window_local = (ImGuiWindow *)
                   CONCAT44(window_local._4_4_,
                            -fVar4 * ((window->SizeFull).x - (window->ScrollbarSizes).x) +
                            snap_x_max);
  }
  pfVar1 = &(window->ScrollTarget).y;
  if (*pfVar1 <= 3.4028235e+38 && *pfVar1 != 3.4028235e+38) {
    fVar2 = ImGuiWindow::TitleBarHeight(window);
    fVar3 = ImGuiWindow::MenuBarHeight(window);
    fVar4 = (window->ScrollTargetCenterRatio).y;
    snap_y_max = (window->ScrollTarget).y;
    if (0.0 < (window->ScrollTargetEdgeSnapDist).y) {
      snap_y_max = CalcScrollEdgeSnap(snap_y_max,0.0,
                                      ((window->ScrollMax).y + (window->Size).y) - (fVar2 + fVar3),
                                      (window->ScrollTargetEdgeSnapDist).y,fVar4);
    }
    window_local = (ImGuiWindow *)
                   CONCAT44(-fVar4 * (((window->SizeFull).y - (window->ScrollbarSizes).y) -
                                     (fVar2 + fVar3)) + snap_y_max,window_local._0_4_);
  }
  fVar4 = ImMax<float>(window_local._0_4_,0.0);
  fVar2 = ImMax<float>(window_local._4_4_,0.0);
  window_local = (ImGuiWindow *)CONCAT44((float)(int)fVar2,(float)(int)fVar4);
  if (((window->Collapsed & 1U) == 0) && ((window->SkipItems & 1U) == 0)) {
    fVar4 = ImMin<float>((float)(int)fVar4,(window->ScrollMax).x);
    fVar2 = ImMin<float>((float)(int)fVar2,(window->ScrollMax).y);
    window_local = (ImGuiWindow *)CONCAT44(fVar2,fVar4);
  }
  return (ImVec2)window_local;
}

Assistant:

static ImVec2 CalcNextScrollFromScrollTargetAndClamp(ImGuiWindow* window)
{
    ImVec2 scroll = window->Scroll;
    if (window->ScrollTarget.x < FLT_MAX)
    {
        float center_x_ratio = window->ScrollTargetCenterRatio.x;
        float scroll_target_x = window->ScrollTarget.x;
        float snap_x_min = 0.0f;
        float snap_x_max = window->ScrollMax.x + window->Size.x;
        if (window->ScrollTargetEdgeSnapDist.x > 0.0f)
            scroll_target_x = CalcScrollEdgeSnap(scroll_target_x, snap_x_min, snap_x_max, window->ScrollTargetEdgeSnapDist.x, center_x_ratio);
        scroll.x = scroll_target_x - center_x_ratio * (window->SizeFull.x - window->ScrollbarSizes.x);
    }
    if (window->ScrollTarget.y < FLT_MAX)
    {
        float decoration_up_height = window->TitleBarHeight() + window->MenuBarHeight();
        float center_y_ratio = window->ScrollTargetCenterRatio.y;
        float scroll_target_y = window->ScrollTarget.y;
        float snap_y_min = 0.0f;
        float snap_y_max = window->ScrollMax.y + window->Size.y - decoration_up_height;
        if (window->ScrollTargetEdgeSnapDist.y > 0.0f)
            scroll_target_y = CalcScrollEdgeSnap(scroll_target_y, snap_y_min, snap_y_max, window->ScrollTargetEdgeSnapDist.y, center_y_ratio);
        scroll.y = scroll_target_y - center_y_ratio * (window->SizeFull.y - window->ScrollbarSizes.y - decoration_up_height);
    }
    scroll.x = IM_FLOOR(ImMax(scroll.x, 0.0f));
    scroll.y = IM_FLOOR(ImMax(scroll.y, 0.0f));
    if (!window->Collapsed && !window->SkipItems)
    {
        scroll.x = ImMin(scroll.x, window->ScrollMax.x);
        scroll.y = ImMin(scroll.y, window->ScrollMax.y);
    }
    return scroll;
}